

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::doit(aalcalc *this,string *subfolder)

{
  pointer pdVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  FILE *pFVar4;
  char *pcVar5;
  size_t sVar6;
  undefined8 extraout_RAX;
  sampleslevelRec sVar7;
  _Base_ptr p_Var8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  sampleslevelRec sVar9;
  bool bVar10;
  int period_no;
  int summary_id;
  string s;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> filehandles;
  string filename;
  int file_index;
  string path;
  sampleslevelRec sr;
  longlong file_offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filelist;
  FILE *in;
  char line [4096];
  int local_1134;
  int local_1124;
  int local_1120;
  uint local_111c;
  undefined1 local_1118 [8];
  sampleslevelRec sStack_1110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1108;
  _Base_ptr local_10f8;
  iterator iStack_10f0;
  _IO_FILE **local_10e8;
  undefined1 local_10e0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  FILE *local_1098;
  sampleslevelRec local_1090;
  vector<double,_std::allocator<double>_> *local_1088;
  _Base_ptr local_1080;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1078;
  undefined1 local_1058 [32];
  sampleslevelRec local_1038 [2];
  undefined1 local_1028 [4088];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_10e0 + 0x28),"work/",subfolder);
  std::__cxx11::string::substr((ulong)local_1038,(ulong)(local_10e0 + 0x28));
  iVar2 = std::__cxx11::string::compare((char *)local_1038);
  if (local_1038[0] != (sampleslevelRec)local_1028) {
    operator_delete((void *)local_1038[0]);
  }
  if (iVar2 != 0) {
    local_1038[0] = (sampleslevelRec)local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1038,local_10b8._M_dataplus._M_p,
               local_10b8._M_dataplus._M_p + local_10b8._M_string_length);
    std::__cxx11::string::append((char *)local_1038);
    std::__cxx11::string::operator=((string *)(local_10e0 + 0x28),(string *)local_1038);
    if (local_1038[0] != (sampleslevelRec)local_1028) {
      operator_delete((void *)local_1038[0]);
    }
  }
  loadoccurrence(this);
  summaryindex::doit((string *)(local_10e0 + 0x28),&this->event_to_period_);
  initsamplesize(this,(string *)(local_10e0 + 0x28));
  getmaxsummaryid(this,(string *)(local_10e0 + 0x28));
  getsamplesizes(this);
  loadperiodtoweighting(this);
  loadensemblemapping(this);
  local_1088 = &this->vec_sample_sum_loss_;
  local_10e0._0_8_ = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_1088,(long)this->samplesize_ + 1,(value_type_conflict2 *)local_10e0);
  std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::resize
            (&this->vec_ensemble_aal_,(long)this->max_ensemble_id_ * (long)this->max_summary_id_ + 1
            );
  std::vector<aal_rec,_std::allocator<aal_rec>_>::resize
            (&this->vec_analytical_aal_,(long)this->max_summary_id_ + 1);
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1078.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10e8 = (_IO_FILE **)0x0;
  local_10f8 = (_Base_ptr)0x0;
  iStack_10f0._M_current = (_IO_FILE **)0x0;
  sVar9 = (sampleslevelRec)((long)local_10e0 + 0x10);
  local_10e0._0_8_ = sVar9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_10e0,local_10b8._M_dataplus._M_p,
             local_10b8._M_dataplus._M_p + local_10b8._M_string_length);
  std::__cxx11::string::append(local_10e0);
  pFVar4 = fopen((char *)local_10e0._0_8_,"rb");
  if (pFVar4 == (FILE *)0x0) {
LAB_0010452a:
    doit((aalcalc *)local_10e0);
  }
  else {
    pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
    if (pcVar5 != (char *)0x0) {
      this_00 = &local_1078;
      do {
        pcVar5 = strchr((char *)local_1038,10);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        local_1118 = (undefined1  [8])&local_1108;
        sVar6 = strlen((char *)local_1038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1118,local_1038,(long)&local_1038[0].sidx + sVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1058,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_10e0 + 0x28),(value_type *)local_1118);
        std::__cxx11::string::operator=((string *)local_10e0,(string *)local_1058);
        if ((FILE *)local_1058._0_8_ != (FILE *)(local_1058 + 0x10)) {
          operator_delete((void *)local_1058._0_8_);
        }
        local_1058._0_8_ = fopen((char *)local_10e0._0_8_,"rb");
        if ((FILE *)local_1058._0_8_ == (FILE *)0x0) {
          doit((aalcalc *)local_1118);
          uVar3 = extraout_EAX;
          goto LAB_001044f6;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)local_1118);
        if (iStack_10f0._M_current == local_10e8) {
          std::vector<_IO_FILE*,std::allocator<_IO_FILE*>>::_M_realloc_insert<_IO_FILE*const&>
                    ((vector<_IO_FILE*,std::allocator<_IO_FILE*>> *)&local_10f8,iStack_10f0,
                     (_IO_FILE **)local_1058);
        }
        else {
          *iStack_10f0._M_current = (_IO_FILE *)local_1058._0_8_;
          iStack_10f0._M_current = iStack_10f0._M_current + 1;
        }
        if (local_1118 != (undefined1  [8])&local_1108) {
          operator_delete((void *)local_1118);
        }
        pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
      } while (pcVar5 != (char *)0x0);
    }
    fclose(pFVar4);
    sVar9 = (sampleslevelRec)&local_1108;
    local_1118 = (undefined1  [8])sVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1118,local_10b8._M_dataplus._M_p,
               local_10b8._M_dataplus._M_p + local_10b8._M_string_length);
    std::__cxx11::string::append(local_1118);
    std::__cxx11::string::operator=((string *)local_10e0,(string *)local_1118);
    if ((sampleslevelRec)local_1118 != sVar9) {
      operator_delete((void *)local_1118);
    }
    pFVar4 = fopen((char *)local_10e0._0_8_,"rb");
    if (pFVar4 != (FILE *)0x0) {
      local_1098 = pFVar4;
      pcVar5 = fgets((char *)local_1038,0x1000,pFVar4);
      if (pcVar5 == (char *)0x0) {
        sVar9.sidx = -1;
        sVar9.loss = 0.0;
        local_1134 = -1;
      }
      else {
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1;
        local_1124 = -1;
        pFVar4 = (FILE *)0x0;
        local_1134 = -1;
        sVar9.sidx = -1;
        sVar9.loss = 0.0;
        do {
          uVar3 = __isoc99_sscanf(local_1038,"%d, %d, %d, %lld",&local_111c,local_10e0 + 0x24,
                                  &local_1120,&local_1080);
          if (uVar3 != 4) {
LAB_001044f6:
            fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",(ulong)this_00 & 0xffffffff,
                    local_1038,(ulong)uVar3);
            exit(-1);
          }
          if (sVar9.sidx != local_111c) {
            if (sVar9.sidx != 0xffffffff) {
              do_calc_end(this,local_1134);
            }
            sVar9.loss = 0.0;
            sVar9.sidx = local_111c;
            this->current_summary_id_ = local_111c;
            local_1134 = -1;
          }
          if (local_1134 != local_1120) {
            if (local_1134 != -1) {
              do_calc_end(this,local_1134);
            }
            local_1134 = local_1120;
          }
          if (local_1124 != local_10e0._36_4_) {
            pFVar4 = *(FILE **)(&local_10f8->_M_color + (long)(int)local_10e0._36_4_ * 2);
            local_1124 = local_10e0._36_4_;
          }
          if (pFVar4 == (FILE *)0x0) {
            doit();
            goto LAB_0010452a;
          }
          local_1118._0_4_ = 0;
          local_1118._4_4_ = 0.0;
          sStack_1110.sidx = 0;
          sStack_1110.loss = 0.0;
          local_1108._M_allocated_capacity._0_4_ = 0;
          local_1108._M_allocated_capacity._4_4_ = 0.0;
          fseek(pFVar4,(long)local_1080,0);
          sVar6 = fread(local_1058,0xc,1,pFVar4);
          if (sVar6 != 0) {
            do {
              sVar6 = fread(&local_1090,8,1,pFVar4);
              bVar10 = local_1090.sidx != 0;
              if (1 < local_1090.sidx + 5U && (bVar10 && sVar6 != 0)) {
                if (sStack_1110 == (sampleslevelRec)local_1108._M_allocated_capacity) {
                  std::vector<sampleslevelRec,std::allocator<sampleslevelRec>>::
                  _M_realloc_insert<sampleslevelRec_const&>
                            ((vector<sampleslevelRec,std::allocator<sampleslevelRec>> *)local_1118,
                             (iterator)sStack_1110,&local_1090);
                }
                else {
                  sVar7.loss = local_1090.loss;
                  sVar7.sidx = local_1090.sidx;
                  *(sampleslevelRec *)sStack_1110 = sVar7;
                  sStack_1110 = (sampleslevelRec)((long)sStack_1110 + 8);
                }
              }
            } while (bVar10 && sVar6 != 0);
          }
          if ((sampleslevelRec)local_1118 != sStack_1110) {
            pdVar1 = (local_1088->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            sVar7 = (sampleslevelRec)local_1118;
            do {
              if (0.0 < *(float *)((long)sVar7 + 4)) {
                iVar2 = *(int *)sVar7;
                if (*(int *)sVar7 == -1) {
                  iVar2 = 0;
                }
                pdVar1[iVar2] = (double)*(float *)((long)sVar7 + 4) + pdVar1[iVar2];
              }
              sVar7 = (sampleslevelRec)((long)sVar7 + 8);
            } while (sVar7 != sStack_1110);
          }
          if ((sampleslevelRec)local_1118 != (sampleslevelRec)0x0) {
            operator_delete((void *)local_1118);
          }
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(ulong)((int)this_00 + 1);
          pcVar5 = fgets((char *)local_1038,0x1000,local_1098);
        } while (pcVar5 != (char *)0x0);
      }
      fclose(local_1098);
      this->current_summary_id_ = sVar9.sidx;
      if (sVar9.sidx != -1) {
        do_calc_end(this,local_1134);
      }
      outputresultscsv_new(this);
      p_Var8 = local_10f8;
      if (local_10f8 != (_Base_ptr)iStack_10f0._M_current) {
        do {
          fclose(*(FILE **)p_Var8);
          p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
        } while (p_Var8 != (_Base_ptr)iStack_10f0._M_current);
      }
      if ((_Base_ptr)iStack_10f0._M_current != local_10f8) {
        iStack_10f0._M_current = (_IO_FILE **)local_10f8;
      }
      if (local_10e0._0_8_ != (long)local_10e0 + 0x10) {
        operator_delete((void *)local_10e0._0_8_);
      }
      if (local_10f8 != (_Base_ptr)0x0) {
        operator_delete(local_10f8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1078);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      return;
    }
  }
  doit((aalcalc *)local_10e0);
  if (local_1038[0] != sVar9) {
    operator_delete((void *)local_1038[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
    operator_delete(local_10b8._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::doit(const std::string& subfolder)
{
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}
	loadoccurrence();
	summaryindex::doit(path, event_to_period_);
	initsamplesize(path);
	getmaxsummaryid(path);
	getsamplesizes();
	loadperiodtoweighting();
	loadensemblemapping();
	char line[4096];
	vec_sample_sum_loss_.resize(samplesize_+1, 0.0);
	vec_ensemble_aal_.resize(max_summary_id_ * max_ensemble_id_ + 1);
	vec_analytical_aal_.resize(max_summary_id_ + 1);
	std::vector<std::string> filelist;
	std::vector<FILE *> filehandles;
	std::string filename = path + "filelist.idx";
	FILE* fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	
	while (fgets(line, sizeof(line), fin) != 0) {
		char *pos;
		if ((pos = strchr(line, '\n')) != NULL) *pos = '\0';   // remove newline from buffer		
		std::string s = line;
		filename = path + s;
		FILE* in = fopen(filename.c_str(), "rb");
		if (in == NULL) {
			fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
			exit(EXIT_FAILURE);
		}
		filelist.push_back(s);
		filehandles.push_back(in);
	}

	fclose(fin);

	int lineno = 1;
	filename = path + "summaries.idx";
	fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summary_id;
	int file_index;
	int period_no;
	long long file_offset;
	int last_summary_id = -1;
	int last_period_no = -1;
	int last_file_index = -1;
	FILE* summary_fin = nullptr;
	while (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d, %d, %d, %lld", &summary_id,
				&file_index, &period_no, &file_offset);
		if (ret != 4) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d",
				lineno, line, ret);
			exit(-1);
		}
		else
		{
			if (last_summary_id != summary_id) {
				if (last_summary_id != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = -1;   // Reset
				current_summary_id_ = summary_id;
				last_summary_id = summary_id;
			}
			if (last_period_no != period_no) {
				if (last_period_no != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = period_no;
			}
			
			if (last_file_index != file_index) {
				last_file_index = file_index;
				summary_fin = filehandles[file_index];
			}
			if (summary_fin != nullptr) {
				std::vector<sampleslevelRec> vrec;
				flseek(summary_fin, file_offset, SEEK_SET);
				summarySampleslevelHeader sh;
				size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, summary_fin);
					if (i == 0 || sr.sidx == 0) break;
					if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
					vrec.push_back(sr);
				}
				do_calc_by_period(sh, vrec);
			}else {
				fprintf(stderr, "FATAL:File handle is a nullptr");
				exit(EXIT_FAILURE);
			}

		}
		lineno++;
	}

	fclose(fin);
	current_summary_id_ = last_summary_id;
	if (last_summary_id != -1) do_calc_end(last_period_no);

	outputresultscsv_new();
	auto iter = filehandles.begin();
	while (iter != filehandles.end()) {
		fclose(*iter);
		iter++;
	}
	filehandles.clear();
}